

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

pair<google::protobuf::Map<int,_int>::iterator,_google::protobuf::Map<int,_int>::iterator> *
__thiscall
google::protobuf::Map<int,_int>::equal_range<int>
          (pair<google::protobuf::Map<int,_int>::iterator,_google::protobuf::Map<int,_int>::iterator>
           *__return_storage_ptr__,Map<int,_int> *this,key_arg<int> *key)

{
  NodeBase *pNVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  NodeBase *pNVar5;
  NodeAndBucket NVar6;
  
  NVar6 = protobuf::internal::KeyMapBase<unsigned_int>::FindHelper
                    (&this->super_KeyMapBase<unsigned_int>,*key);
  pNVar1 = NVar6.node;
  uVar4 = NVar6.bucket;
  uVar2 = uVar4;
  if (pNVar1 == (NodeBase *)0x0) {
    pNVar1 = (NodeBase *)0x0;
    pNVar5 = (NodeBase *)0x0;
  }
  else {
    pNVar5 = pNVar1->next;
    if (pNVar5 == (NodeBase *)0x0) {
      uVar3 = NVar6._8_8_ & 0xffffffff;
      do {
        uVar2 = (int)uVar3 + 1;
        uVar3 = (ulong)uVar2;
        if ((this->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.num_buckets_ <= uVar2) {
          pNVar5 = (NodeBase *)0x0;
          uVar2 = 0;
          break;
        }
        pNVar5 = (this->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.table_[uVar2];
      } while (pNVar5 == (NodeBase *)0x0);
    }
  }
  (__return_storage_ptr__->first).super_UntypedMapIterator.node_ = pNVar1;
  (__return_storage_ptr__->first).super_UntypedMapIterator.m_ = (UntypedMapBase *)this;
  (__return_storage_ptr__->first).super_UntypedMapIterator.bucket_index_ = uVar4;
  (__return_storage_ptr__->second).super_UntypedMapIterator.node_ = pNVar5;
  (__return_storage_ptr__->second).super_UntypedMapIterator.m_ = (UntypedMapBase *)this;
  (__return_storage_ptr__->second).super_UntypedMapIterator.bucket_index_ = uVar2;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, iterator> equal_range(const key_arg<K>& key)
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    iterator it = find(key);
    if (it == end()) {
      return std::pair<iterator, iterator>(it, it);
    } else {
      iterator begin = it++;
      return std::pair<iterator, iterator>(begin, it);
    }
  }